

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * create_sampler_address_abi_cxx11_
                   (string *__return_storage_ptr__,char *prefix,MSLSamplerAddress addr)

{
  CompilerError *this;
  char *pcStack_18;
  MSLSamplerAddress addr_local;
  char *prefix_local;
  
  pcStack_18 = prefix;
  prefix_local = (char *)__return_storage_ptr__;
  switch(addr) {
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
    spirv_cross::join<char_const*&,char_const(&)[23]>
              (__return_storage_ptr__,(spirv_cross *)&stack0xffffffffffffffe8,
               (char **)"address::clamp_to_zero",
               (char (*) [23])&switchD_00335411::switchdataD_0059a754);
    break;
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
    spirv_cross::join<char_const*&,char_const(&)[23]>
              (__return_storage_ptr__,(spirv_cross *)&stack0xffffffffffffffe8,
               (char **)"address::clamp_to_edge",
               (char (*) [23])&switchD_00335411::switchdataD_0059a754);
    break;
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
    spirv_cross::join<char_const*&,char_const(&)[25]>
              (__return_storage_ptr__,(spirv_cross *)&stack0xffffffffffffffe8,
               (char **)"address::clamp_to_border",
               (char (*) [25])&switchD_00335411::switchdataD_0059a754);
    break;
  case MSL_SAMPLER_ADDRESS_REPEAT:
    spirv_cross::join<char_const*&,char_const(&)[16]>
              (__return_storage_ptr__,(spirv_cross *)&stack0xffffffffffffffe8,
               (char **)"address::repeat",(char (*) [16])&switchD_00335411::switchdataD_0059a754);
    break;
  case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
    spirv_cross::join<char_const*&,char_const(&)[25]>
              (__return_storage_ptr__,(spirv_cross *)&stack0xffffffffffffffe8,
               (char **)"address::mirrored_repeat",
               (char (*) [25])&switchD_00335411::switchdataD_0059a754);
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Invalid sampler addressing mode.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return __return_storage_ptr__;
}

Assistant:

static string create_sampler_address(const char *prefix, MSLSamplerAddress addr)
{
	switch (addr)
	{
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
		return join(prefix, "address::clamp_to_edge");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
		return join(prefix, "address::clamp_to_zero");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
		return join(prefix, "address::clamp_to_border");
	case MSL_SAMPLER_ADDRESS_REPEAT:
		return join(prefix, "address::repeat");
	case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
		return join(prefix, "address::mirrored_repeat");
	default:
		SPIRV_CROSS_THROW("Invalid sampler addressing mode.");
	}
}